

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::emitDelegate(BinaryInstWriter *this,Try *curr)

{
  bool bVar1;
  uint value;
  BufferWithRandomAccess *this_00;
  U32LEB local_1c;
  Try *local_18;
  Try *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (Try *)this;
  bVar1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty(&this->breakStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!breakStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0x881,"void wasm::BinaryInstWriter::emitDelegate(Try *)");
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::pop_back(&this->breakStack);
  this_00 = BufferWithRandomAccess::operator<<(this->o,'\x18');
  value = getBreakIndex(this,(Name)(local_18->delegateTarget).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,value);
  BufferWithRandomAccess::operator<<(this_00,local_1c);
  return;
}

Assistant:

void BinaryInstWriter::emitDelegate(Try* curr) {
  // The delegate ends the scope in effect, and pops the try's name. Note that
  // the getBreakIndex is intentionally after that pop, as the delegate cannot
  // target its own try.
  assert(!breakStack.empty());
  breakStack.pop_back();
  o << int8_t(BinaryConsts::Delegate)
    << U32LEB(getBreakIndex(curr->delegateTarget));
}